

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

void __thiscall
NeuralConsumer::NeuralConsumer
          (NeuralConsumer *this,HighFreqDataType *hf,int ringbufsize,HFParsingInfo *parseargs)

{
  int iVar1;
  allocator_type local_bb;
  value_type_conflict3 local_ba;
  HighFreqDataType local_b8;
  
  HighFreqDataType::HighFreqDataType(&local_b8,hf);
  HFSubConsumer::HFSubConsumer
            (&this->super_HFSubConsumer,&local_b8,(long)ringbufsize,default_consumer_queue_filter);
  HighFreqDataType::~HighFreqDataType(&local_b8);
  (this->super_HFSubConsumer).super_HighFreqSub._vptr_HighFreqSub =
       (_func_int **)&PTR__NeuralConsumer_002fa328;
  iVar1 = HighFreqDataType::getByteSize(hf);
  local_ba = 0;
  std::vector<short,_std::allocator<short>_>::vector
            (&this->tempinput,(ulong)(long)iVar1 >> 1,&local_ba,&local_bb);
  HFParsingInfo::HFParsingInfo(&this->args,parseargs);
  (this->super_HFSubConsumer).super_HighFreqSub.sockType = ST_FILTERED_CONSUMER;
  return;
}

Assistant:

NeuralConsumer::NeuralConsumer(HighFreqDataType hf, int ringbufsize, HFParsingInfo parseargs)
    : HFSubConsumer(hf, ringbufsize),
      tempinput(hf.getByteSize()/sizeof(int16_t), 0),
      args(parseargs)
{
    sockType = ST_FILTERED_CONSUMER;
}